

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monotone_partitioning.cc
# Opt level: O3

void __thiscall
PolygonTriangulation::add_vertex_to_monochain
          (PolygonTriangulation *this,Trapezoid_t *trapezoid,bool go_down,Monochain_t *monochain)

{
  size_t *psVar1;
  uint32_t uVar2;
  _List_node_base *p_Var3;
  undefined3 in_register_00000011;
  
  uVar2 = (&trapezoid->max_y)[CONCAT31(in_register_00000011,go_down)];
  p_Var3 = (_List_node_base *)operator_new(0x18);
  *(uint32_t *)&p_Var3[1]._M_next = uVar2;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar1 = &(monochain->list).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            _M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void PolygonTriangulation::add_vertex_to_monochain(
    const Trapezoid_t &trapezoid,
    const bool go_down,
    Monochain_t *monochain
) {
  /// * Insertion order depends on the side :
  /// When is left : up pushed back, down pushed front
  /// When is right : down pushed back, up pushed front

  const auto vertex_index = (go_down) ? trapezoid.min_y : trapezoid.max_y;

  /// To insert vertices in direct order we look for the direction.
  if ((InsertRight == monochain->insertion_side) == go_down) {
    monochain->list.push_back(vertex_index);
  } else {
    monochain->list.push_front(vertex_index);
  }
}